

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustach.c
# Opt level: O3

int process(char *template,mustach_itf *itf,void *closure,FILE *file,char *opstr,char *clstr)

{
  char cVar1;
  long lVar2;
  void *pvVar3;
  _func_int_void_ptr *p_Var4;
  _func_int_void_ptr_char_ptr *p_Var5;
  _func_int_void_ptr_char_ptr_int_FILE_ptr *p_Var6;
  mustach_itf *itf_00;
  int iVar7;
  int iVar8;
  char *pcVar9;
  char *__n;
  ushort **ppuVar10;
  FILE *pFVar11;
  long lVar12;
  size_t sVar13;
  uint uVar14;
  int iVar15;
  byte *pbVar16;
  byte *pbVar17;
  size_t *psVar18;
  byte bVar19;
  int iVar20;
  char *pcVar21;
  char *pcVar22;
  size_t *psVar23;
  long in_FS_OFFSET;
  size_t local_2498;
  char *local_2490;
  FILE *local_2488;
  char *local_2480;
  mustach_itf *local_2478;
  void *local_2470;
  char *local_2468;
  int local_2460;
  int local_245c;
  char *local_2458;
  size_t local_2450 [2];
  anon_struct_32_5_7b674a85 stack [256];
  char name [1025];
  
  psVar23 = &local_2498;
  psVar18 = &local_2498;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  local_2488 = (FILE *)file;
  local_2478 = itf;
  pcVar9 = strstr(template,opstr);
  if (pcVar9 == (char *)0x0) {
    iVar8 = 0;
  }
  else {
    local_2480 = clstr;
    local_2470 = closure;
    local_2498 = strlen(clstr);
    local_2490 = opstr;
    __n = (char *)strlen(opstr);
    iVar20 = 1;
    local_245c = 0;
    do {
      pFVar11 = local_2488;
      if (iVar20 != 0) {
        *(undefined8 *)((long)psVar23 + -8) = 0x104cdb;
        fwrite(template,(long)pcVar9 - (long)template,1,pFVar11);
      }
      pcVar21 = local_2480;
      pbVar16 = (byte *)(pcVar9 + (long)__n);
      *(undefined8 *)((long)psVar23 + -8) = 0x104ced;
      pcVar9 = strstr((char *)pbVar16,pcVar21);
      if (pcVar9 == (char *)0x0) {
        iVar8 = -2;
        goto LAB_0010526a;
      }
      template = pcVar9 + local_2498;
      pcVar21 = pcVar9 + -(long)pbVar16;
      bVar19 = *pbVar16;
      uVar14 = bVar19 - 0x21;
      local_2460 = iVar20;
      if (uVar14 < 0x3e) {
        if ((0x2000000020004024U >> ((ulong)uVar14 & 0x3f) & 1) != 0) goto LAB_00104d2b;
        if ((0x10000001UL >> ((ulong)uVar14 & 0x3f) & 1) == 0) goto LAB_00104eed;
      }
      else {
LAB_00104eed:
        if (bVar19 == 0x7b) {
          for (lVar12 = 0; local_2480[lVar12] == '}'; lVar12 = lVar12 + 1) {
          }
          if (local_2480[lVar12] == '\0') {
            if (pcVar9[lVar12] != '}') {
              iVar8 = -8;
              goto LAB_0010526a;
            }
            template = template + 1;
          }
          else {
            iVar8 = -8;
            if ((pcVar21 == (char *)0x0) || ((pbVar16 + -1)[(long)pcVar21] != 0x7d))
            goto LAB_0010526a;
            pcVar21 = pcVar21 + -1;
          }
          bVar19 = 0x26;
LAB_00104d2b:
          pbVar16 = pbVar16 + 1;
          pcVar21 = pcVar21 + -1;
        }
        pbVar17 = pbVar16;
        if (pcVar21 != (char *)0x0) {
          *(undefined8 *)((long)psVar23 + -8) = 0x104d3e;
          ppuVar10 = __ctype_b_loc();
          pbVar17 = pbVar16 + (long)pcVar21;
          do {
            if ((*(byte *)((long)*ppuVar10 + (long)(char)*pbVar16 * 2 + 1) & 0x20) == 0)
            goto LAB_00104d5e;
            pbVar16 = pbVar16 + 1;
            pcVar21 = pcVar21 + -1;
          } while (pcVar21 != (char *)0x0);
        }
        pcVar21 = (char *)0x0;
        pbVar16 = pbVar17;
LAB_00104d5e:
        pcVar21 = pcVar21 + 1;
        do {
          if (pcVar21 == (char *)0x1) {
            iVar8 = -3;
            goto LAB_0010526a;
          }
          *(undefined8 *)((long)psVar23 + -8) = 0x104d70;
          ppuVar10 = __ctype_b_loc();
          pbVar17 = pbVar16 + -2 + (long)pcVar21;
          pcVar21 = pcVar21 + -1;
        } while ((*(byte *)((long)*ppuVar10 + (long)(char)*pbVar17 * 2 + 1) & 0x20) != 0);
        if ((char *)0x400 < pcVar21) {
          iVar8 = -4;
          goto LAB_0010526a;
        }
        *(undefined8 *)((long)psVar23 + -8) = 0x104da2;
        memcpy(&stack[0xff].emit,pbVar16,(size_t)pcVar21);
        *(char *)((long)&stack[0xff].emit + (long)pcVar21) = '\0';
      }
      iVar20 = local_2460;
      pvVar3 = local_2470;
      pFVar11 = local_2488;
      iVar15 = local_245c;
      if (bVar19 < 0x3d) {
        if (bVar19 != 0x21) {
          if (bVar19 == 0x23) goto LAB_00104f0d;
          if (bVar19 == 0x2f) {
            iVar8 = -7;
            iVar15 = local_245c + -1;
            local_2468 = template;
            if ((local_245c == 0) || (pcVar21 != stack[iVar15].again)) goto LAB_0010526a;
            pvVar3 = *(void **)&stack[(long)iVar15 + -1].emit;
            *(undefined8 *)((long)psVar23 + -8) = 0x104e35;
            iVar7 = bcmp(pvVar3,&stack[0xff].emit,(size_t)pcVar21);
            iVar20 = local_2460;
            pvVar3 = local_2470;
            if (iVar7 != 0) goto LAB_0010526a;
            if ((local_2460 != 0) && (*(int *)((long)&stack[iVar15].length + 4) != 0)) {
              p_Var4 = local_2478->next;
              *(undefined8 *)((long)psVar23 + -8) = 0x104e69;
              iVar8 = (*p_Var4)(pvVar3);
              if (iVar8 < 0) goto LAB_0010526a;
              if (iVar8 != 0) {
                template = stack[iVar15].name;
                iVar15 = local_245c;
                goto LAB_00105200;
              }
            }
            pvVar3 = local_2470;
            iVar20 = (int)stack[iVar15].length;
            template = local_2468;
            if (iVar20 == 0) {
              iVar20 = 0;
            }
            else if (*(int *)((long)&stack[iVar15].length + 4) != 0) {
              p_Var4 = local_2478->leave;
              *(undefined8 *)((long)psVar23 + -8) = 0x105116;
              (*p_Var4)(pvVar3);
              template = local_2468;
            }
          }
          else {
LAB_00104f73:
            if (local_2460 == 0) goto LAB_00105072;
            p_Var6 = local_2478->put;
            *(undefined8 *)((long)psVar23 + -8) = 0x104fab;
            iVar8 = (*p_Var6)(pvVar3,(char *)&stack[0xff].emit,SUB14(bVar19 != 0x26,0),
                              (FILE *)pFVar11);
            iVar15 = local_245c;
            if (iVar8 < 0) goto LAB_0010526a;
          }
        }
      }
      else if (bVar19 == 0x5e) {
LAB_00104f0d:
        if (local_245c == 0x100) {
          iVar8 = -6;
          goto LAB_0010526a;
        }
        local_2468 = (char *)CONCAT71(local_2468._1_7_,bVar19);
        if (local_2460 == 0) {
          iVar8 = 0;
        }
        else {
          p_Var5 = local_2478->enter;
          *(undefined8 *)((long)psVar23 + -8) = 0x104f49;
          iVar8 = (*p_Var5)(pvVar3,(char *)&stack[0xff].emit);
          if (iVar8 < 0) goto LAB_0010526a;
        }
        cVar1 = *template;
        lVar12 = (long)local_245c;
        *(byte **)&stack[lVar12 + -1].emit = pbVar16;
        stack[lVar12].name = template + (cVar1 == '\n');
        stack[lVar12].again = pcVar21;
        *(int *)&stack[lVar12].length = local_2460;
        *(int *)((long)&stack[lVar12].length + 4) = iVar8;
        iVar20 = local_2460;
        if ((iVar8 != 0) != ((char)local_2468 == '#')) {
          iVar20 = 0;
        }
        template = template + (cVar1 == '\n');
        iVar15 = local_245c + 1;
      }
      else if (bVar19 == 0x3e) {
        if (local_2460 != 0) {
          local_2458 = (char *)0x0;
          *(undefined8 *)((long)psVar23 + -8) = 0x104fd8;
          pFVar11 = tmpfile();
          pvVar3 = local_2470;
          if (pFVar11 != (FILE *)0x0) {
            p_Var6 = local_2478->put;
            *(undefined8 *)((long)psVar23 + -8) = 0x105001;
            iVar8 = (*p_Var6)(pvVar3,(char *)&stack[0xff].emit,0,(FILE *)pFVar11);
            if (iVar8 < 0) {
              *(undefined8 *)((long)psVar23 + -8) = 0x1052c3;
              fclose(pFVar11);
              goto LAB_0010526a;
            }
            *(undefined8 *)((long)psVar23 + -8) = 0x10501f;
            iVar8 = memfile_close((FILE *)pFVar11,&local_2458,local_2450);
            pcVar22 = local_2458;
            pvVar3 = local_2470;
            itf_00 = local_2478;
            pcVar21 = local_2480;
            pFVar11 = local_2488;
            pcVar9 = local_2490;
            if (iVar8 == 0) {
              *(undefined8 *)((long)psVar23 + -8) = 0x105059;
              iVar8 = process(pcVar22,itf_00,pvVar3,(FILE *)pFVar11,pcVar9,pcVar21);
              *(undefined8 *)((long)psVar23 + -8) = 0x105064;
              free(pcVar22);
              iVar15 = local_245c;
              if (-1 < iVar8) goto LAB_00105200;
              goto LAB_0010526a;
            }
          }
          iVar8 = -1;
          goto LAB_0010526a;
        }
LAB_00105072:
        iVar20 = 0;
      }
      else {
        if (bVar19 != 0x3d) goto LAB_00104f73;
        iVar8 = -5;
        local_2468 = template;
        if ((pcVar21 < (char *)0x5) || ((pcVar21 + -1)[(long)pbVar16] != '=')) goto LAB_0010526a;
        pbVar16 = pbVar16 + 1;
        pcVar21 = pcVar21 + -2;
        *(undefined8 *)((long)psVar23 + -8) = 0x104eca;
        ppuVar10 = __ctype_b_loc();
        __n = (char *)0x0;
        while ((*(byte *)((long)*ppuVar10 + (long)(char)pbVar16[(long)__n] * 2 + 1) & 0x20) == 0) {
          __n = __n + 1;
          if (pcVar21 == __n) goto LAB_0010526a;
        }
        if (pcVar21 == __n) goto LAB_0010526a;
        pcVar22 = (char *)((long)psVar23 + -((ulong)(__n + 0x10) & 0xfffffffffffffff0));
        builtin_strncpy((char *)((long)psVar23 + -((ulong)(__n + 0x10) & 0xfffffffffffffff0) + -8),
                        "iQ\x10",4);
        pcVar22[-4] = '\0';
        pcVar22[-3] = '\0';
        pcVar22[-2] = '\0';
        pcVar22[-1] = '\0';
        memcpy(pcVar22,pbVar16,(size_t)__n);
        local_2490 = pcVar22;
        __n[(long)pcVar22] = '\0';
        pcVar9 = __n;
        psVar23 = (size_t *)pcVar22;
        if (__n < pcVar21) {
          pcVar22[-8] = -0x7e;
          pcVar22[-7] = 'Q';
          pcVar22[-6] = '\x10';
          pcVar22[-5] = '\0';
          pcVar22[-4] = '\0';
          pcVar22[-3] = '\0';
          pcVar22[-2] = '\0';
          pcVar22[-1] = '\0';
          ppuVar10 = __ctype_b_loc();
          while ((*(byte *)((long)*ppuVar10 + (long)(char)pbVar16[(long)pcVar9] * 2 + 1) & 0x20) !=
                 0) {
            pcVar9 = pcVar9 + 1;
            if (pcVar21 == pcVar9) goto LAB_0010526a;
          }
        }
        sVar13 = (long)pcVar21 - (long)pcVar9;
        if (sVar13 == 0) goto LAB_0010526a;
        psVar23 = (size_t *)(pcVar22 + -(sVar13 + 0x10 & 0xfffffffffffffff0));
        *(char *)((long)psVar23 + -8) = -0x34;
        *(char *)((long)psVar23 + -7) = 'Q';
        *(char *)((long)psVar23 + -6) = '\x10';
        *(char *)((long)psVar23 + -5) = '\0';
        *(char *)((long)psVar23 + -4) = '\0';
        *(char *)((long)psVar23 + -3) = '\0';
        *(char *)((long)psVar23 + -2) = '\0';
        *(char *)((long)psVar23 + -1) = '\0';
        memcpy(psVar23,pbVar16 + (long)pcVar9,sVar13);
        local_2480 = (char *)psVar23;
        *(char *)((long)psVar23 + sVar13) = '\0';
        template = local_2468;
        iVar20 = local_2460;
        local_2498 = sVar13;
        iVar15 = local_245c;
      }
LAB_00105200:
      local_245c = iVar15;
      pcVar9 = local_2490;
      builtin_strncpy((char *)((long)psVar23 + -8),"\x0fR\x10",4);
      *(char *)((long)psVar23 + -4) = '\0';
      *(char *)((long)psVar23 + -3) = '\0';
      *(char *)((long)psVar23 + -2) = '\0';
      *(char *)((long)psVar23 + -1) = '\0';
      pcVar9 = strstr(template,pcVar9);
    } while (pcVar9 != (char *)0x0);
    iVar8 = (uint)(local_245c == 0) * 2 + -2;
    psVar18 = psVar23;
    if (iVar20 == 0) goto LAB_0010526a;
  }
  *(undefined8 *)((long)psVar18 + -8) = 0x105253;
  sVar13 = strlen(template);
  pFVar11 = local_2488;
  *(undefined8 *)((long)psVar18 + -8) = 0x10526a;
  fwrite(template,sVar13,1,pFVar11);
  psVar23 = psVar18;
LAB_0010526a:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    *(code **)((long)psVar23 + -8) = fdmustach;
    __stack_chk_fail();
  }
  return iVar8;
}

Assistant:

static int process(const char *template, struct mustach_itf *itf, void *closure, FILE *file, const char *opstr, const char *clstr)
{
	char name[NAME_LENGTH_MAX + 1], *partial, c, *tmp;
	const char *beg, *term;
	struct { const char *name, *again; size_t length; int emit, entered; } stack[DEPTH_MAX];
	size_t oplen, cllen, len, l;
	int depth, rc, emit;

	emit = 1;
	oplen = strlen(opstr);
	cllen = strlen(clstr);
	depth = 0;
	for(;;) {
		beg = strstr(template, opstr);
		if (beg == NULL) {
			/* no more mustach */
			if (emit)
				fwrite(template, strlen(template), 1, file);
			return depth ? MUSTACH_ERROR_UNEXPECTED_END : 0;
		}
		if (emit)
			fwrite(template, (size_t)(beg - template), 1, file);
		beg += oplen;
		term = strstr(beg, clstr);
		if (term == NULL)
			return MUSTACH_ERROR_UNEXPECTED_END;
		template = term + cllen;
		len = (size_t)(term - beg);
		c = *beg;
		switch(c) {
		case '!':
		case '=':
			break;
		case '{':
			for (l = 0 ; clstr[l] == '}' ; l++);
			if (clstr[l]) {
				if (!len || beg[len-1] != '}')
					return MUSTACH_ERROR_BAD_UNESCAPE_TAG;
				len--;
			} else {
				if (term[l] != '}')
					return MUSTACH_ERROR_BAD_UNESCAPE_TAG;
				template++;
			}
			c = '&';
			/*@fallthrough@*/
		case '^':
		case '#':
		case '/':
		case '&':
		case '>':
#if !defined(NO_EXTENSION_FOR_MUSTACH) && !defined(NO_COLON_EXTENSION_FOR_MUSTACH)
		case ':':
#endif
			beg++; len--;
		default:
			while (len && isspace(beg[0])) { beg++; len--; }
			while (len && isspace(beg[len-1])) len--;
#if defined(NO_EXTENSION_FOR_MUSTACH) || defined(NO_ALLOW_EMPTY_TAG)
			if (len == 0)
				return MUSTACH_ERROR_EMPTY_TAG;
#endif
			if (len > NAME_LENGTH_MAX)
				return MUSTACH_ERROR_TAG_TOO_LONG;
			memcpy(name, beg, len);
			name[len] = 0;
			break;
		}
		switch(c) {
		case '!':
			/* comment */
			/* nothing to do */
			break;
		case '=':
			/* defines separators */
			if (len < 5 || beg[len - 1] != '=')
				return MUSTACH_ERROR_BAD_SEPARATORS;
			beg++;
			len -= 2;
			for (l = 0; l < len && !isspace(beg[l]) ; l++);
			if (l == len)
				return MUSTACH_ERROR_BAD_SEPARATORS;
			oplen = l;
			tmp = alloca(oplen + 1);
			memcpy(tmp, beg, oplen);
			tmp[oplen] = 0;
			opstr = tmp;
			while (l < len && isspace(beg[l])) l++;
			if (l == len)
				return MUSTACH_ERROR_BAD_SEPARATORS;
			cllen = len - l;
			tmp = alloca(cllen + 1);
			memcpy(tmp, beg + l, cllen);
			tmp[cllen] = 0;
			clstr = tmp;
			break;
		case '^':
		case '#':
			/* begin section */
			if (depth == DEPTH_MAX)
				return MUSTACH_ERROR_TOO_DEEP;
			rc = emit;
			if (rc) {
				rc = itf->enter(closure, name);
				if (rc < 0)
					return rc;
			}

			if (template[0] == '\n')
				++template;

			stack[depth].name = beg;
			stack[depth].again = template;
			stack[depth].length = len;
			stack[depth].emit = emit;
			stack[depth].entered = rc;
			if ((c == '#') == (rc == 0))
				emit = 0;
			depth++;
			break;
		case '/':
			/* end section */
			if (depth-- == 0 || len != stack[depth].length || memcmp(stack[depth].name, name, len))
				return MUSTACH_ERROR_CLOSING;
			rc = emit && stack[depth].entered ? itf->next(closure) : 0;
			if (rc < 0)
				return rc;
			if (rc) {
				template = stack[depth++].again;
			} else {
				emit = stack[depth].emit;
				if (emit && stack[depth].entered)
					itf->leave(closure);
			}
			break;
		case '>':
			/* partials */
			if (emit) {
				rc = getpartial(itf, closure, name, &partial);
				if (rc == 0) {
					rc = process(partial, itf, closure, file, opstr, clstr);
					free(partial);
				}
				if (rc < 0)
					return rc;
			}
			break;
		default:
			/* replacement */
			if (emit) {
				rc = itf->put(closure, name, c != '&', file);
				if (rc < 0)
					return rc;
			}
			break;
		}
	}
}